

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::checkRemoveAcceleratorInfo(CLIntercept *this,cl_accelerator_intel accelerator)

{
  bool bVar1;
  cl_int cVar2;
  pointer ppVar3;
  CLdispatchX *pCVar4;
  iterator __position;
  cl_accelerator_intel in_RSI;
  cl_int errorCode;
  cl_uint refCount;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  iterator iter;
  lock_guard<std::mutex> lock;
  string *in_stack_00000518;
  cl_platform_id in_stack_00000520;
  CLIntercept *in_stack_00000528;
  map<_cl_accelerator_intel_*,__cl_platform_id_*,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
  *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  cl_platform_id in_stack_ffffffffffffff50;
  CLIntercept *in_stack_ffffffffffffff58;
  int local_74;
  CLdispatchX *local_70;
  undefined1 local_61 [41];
  _Self local_38 [3];
  _Self local_20 [2];
  cl_accelerator_intel local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
             ,(mutex_type *)in_stack_ffffffffffffff38);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_accelerator_intel_*,__cl_platform_id_*,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x209c5e);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_accelerator_intel_*,__cl_platform_id_*,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator!=(local_20,local_38);
  if (bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>::
             operator->((_Rb_tree_iterator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>
                         *)0x209cb6);
    local_61._33_8_ = ppVar3->second;
    pCVar4 = CLIntercept::dispatchX(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (pCVar4->clGetAcceleratorInfoINTEL ==
        (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)
        0x0) {
      in_stack_ffffffffffffff58 = (CLIntercept *)local_61;
      in_stack_ffffffffffffff50 = (cl_platform_id)local_61._33_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_61 + 1),"clGetAcceleratorInfoINTEL",
                 (allocator *)in_stack_ffffffffffffff58);
      getExtensionFunctionAddress(in_stack_00000528,in_stack_00000520,in_stack_00000518);
      std::__cxx11::string::~string((string *)(local_61 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_61);
    }
    __position._M_node =
         (_Base_ptr)CLIntercept::dispatchX(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_70 = (CLdispatchX *)__position._M_node;
    if (((CLdispatchX *)__position._M_node)->clGetAcceleratorInfoINTEL !=
        (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)
        0x0) {
      local_74 = 0;
      cVar2 = (*((CLdispatchX *)__position._M_node)->clGetAcceleratorInfoINTEL)
                        (local_10,0x4091,4,&local_74,(size_t *)0x0);
      if ((cVar2 == 0) && (local_74 == 1)) {
        std::
        map<_cl_accelerator_intel*,_cl_platform_id*,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
        ::erase_abi_cxx11_((map<_cl_accelerator_intel_*,__cl_platform_id_*,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
                            *)(ulong)in_stack_ffffffffffffff40,__position);
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x209e79);
  return;
}

Assistant:

void CLIntercept::checkRemoveAcceleratorInfo(
    cl_accelerator_intel accelerator )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CAcceleratorInfoMap::iterator iter = m_AcceleratorInfoMap.find( accelerator );
    if( iter != m_AcceleratorInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetAcceleratorInfoINTEL" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetAcceleratorInfoINTEL )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;

            errorCode = dispatchX.clGetAcceleratorInfoINTEL(
                accelerator,
                CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_AcceleratorInfoMap.erase( iter );
            }
        }
    }
}